

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O2

zt_log_ctx_ty * zt_log_get_ctx(void)

{
  zt_log_ctx_ty *__pointer;
  
  pthread_once(&ctx_key_once,make_ctx_key);
  __pointer = (zt_log_ctx_ty *)pthread_getspecific(ctx_key);
  if (__pointer == (zt_log_ctx_ty *)0x0) {
    __pointer = (zt_log_ctx_ty *)zt_calloc_p(1,0x18);
    if (__pointer == (zt_log_ctx_ty *)0x0) {
      fwrite("Could not allocate memory for log context\n",0x2a,1,_stderr);
      exit(1);
    }
    pthread_setspecific(ctx_key,__pointer);
  }
  return __pointer;
}

Assistant:

static zt_log_ctx_ty *
zt_log_get_ctx(void) {
    CTX_STATIC zt_log_ctx_ty * log_ctx_ptr = NULL;

    if (!log_ctx_ptr) {
#ifdef HAVE_PTHREADS
        (void)pthread_once(&ctx_key_once, make_ctx_key);
        if ((log_ctx_ptr = pthread_getspecific(ctx_key)) == NULL) {
#endif /* HAVE_PTHREADS */
        if ((log_ctx_ptr = zt_calloc(zt_log_ctx_ty, 1)) == NULL) {
            fprintf(stderr, "Could not allocate memory for log context\n");
            exit(1);
        }
#ifdef HAVE_PTHREADS
        pthread_setspecific(ctx_key, log_ctx_ptr);
    }
#endif /* HAVE_PTHREADS */
    }
    return log_ctx_ptr;
}